

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_summaries,CaptureSummary **cs)

{
  pointer *ppp_Var1;
  value_type p_Var2;
  uint64_t uVar3;
  CaptureLine *pCVar4;
  value_type __dest;
  int iVar5;
  char *__s2;
  char *__s2_00;
  char *__s2_01;
  char *__s;
  char *__s_00;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  CaptureLine *pCVar10;
  iterator iVar11;
  iterator iVar12;
  size_type sVar13;
  reference pp_Var14;
  bool bVar15;
  bool local_5f9;
  bool local_5b1;
  ulong local_568;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  CaptureLine length_pattern;
  ulong uStack_478;
  int i_8;
  size_t i_7;
  size_t len_1;
  size_t i_6;
  size_t i_5;
  ulong local_448;
  size_t i_4;
  ulong local_430;
  size_t i_3;
  value_type local_418;
  CaptureLine *tld_line_1;
  CaptureLine *second_ld_line;
  CaptureLine *tld_line;
  size_t i_2;
  __normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
  local_3f0;
  size_t local_3e8;
  size_t len;
  size_t j;
  size_t i_1;
  size_t i;
  uint64_t skipped_tld_length [64];
  value_type local_1b0;
  CaptureLine *local_leak;
  uint64_t nb_locally_leaked_tld;
  CaptureLine current_line;
  char *addr_list_id;
  char *name_list_id;
  char *leak_by_length_id;
  char *local_tld_id;
  char *frequent_tld_id;
  char *leak_2ld_id;
  char *leak_tld_id;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> frequent_tld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_2ld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_tld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> complete;
  size_t complete_size;
  size_t max_size;
  bool ret;
  CaptureSummary **cs_local;
  size_t nb_summaries_local;
  CaptureSummary *this_local;
  
  complete_size = 0;
  complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
             &leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
             &leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
             &frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id);
  current_line.count = 0;
  local_leak = (CaptureLine *)0x0;
  local_1b0 = (value_type)operator_new(0xd0);
  memset(&i,0,0x200);
  __s2 = DnsStats::GetTableName(0x1d);
  __s2_00 = DnsStats::GetTableName(0x38);
  __s2_01 = DnsStats::GetTableName(0x26);
  __s = DnsStats::GetTableName(0x28);
  __s_00 = DnsStats::GetTableName(0x1c);
  pcVar6 = DnsStats::GetTableName(0x3a);
  current_line.count = (uint64_t)DnsStats::GetTableName(0x39);
  local_5b1 = false;
  if ((((__s2 != (char *)0x0) && (local_5b1 = false, __s2_01 != (char *)0x0)) &&
      (local_5b1 = false, __s != (char *)0x0)) &&
     (((local_5b1 = false, __s_00 != (char *)0x0 &&
       (local_5b1 = false, local_1b0 != (value_type)0x0)) &&
      (local_5b1 = false, pcVar6 != (char *)0x0)))) {
    local_5b1 = (char *)current_line.count != (char *)0x0;
  }
  for (i_1 = 0; local_5b1 != false && i_1 < nb_summaries; i_1 = i_1 + 1) {
    sVar7 = Size(cs[i_1]);
    if (complete_size < sVar7) {
      complete_size = Size(cs[i_1]);
    }
    sVar7 = Size(cs[i_1]);
    complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar7 + (long)complete.
                                 super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_5b1 != false) {
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
               &leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (size_type)
               complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
               &leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,nb_summaries * 0x30);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
               &frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,nb_summaries * 0x30);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id,
               nb_summaries << 4);
  }
  for (j = 0; __dest = local_1b0, local_5b1 != false && j < nb_summaries; j = j + 1) {
    for (len = 0; sVar7 = len, sVar8 = Size(cs[j]), sVar7 < sVar8; len = len + 1) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           (&cs[j]->summary,len);
      iVar5 = strcmp((*pp_Var14)->registry_name,__s2_01);
      if (iVar5 == 0) {
        pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             (&cs[j]->summary,len);
        p_Var2 = *pp_Var14;
        pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             (&cs[j]->summary,len);
        sVar9 = strlen(((*pp_Var14)->field_2).key_value);
        bVar15 = DnsStats::IsFrequentLeakTld((uint8_t *)(p_Var2->field_2).key_value,sVar9);
        if (bVar15) {
          pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                               (&cs[j]->summary,len);
          std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                    ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                     &leaked_tld.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pp_Var14);
        }
        else {
          pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                               (&cs[j]->summary,len);
          local_leak = (CaptureLine *)(local_leak->registry_name + (*pp_Var14)->count);
        }
      }
      else {
        pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             (&cs[j]->summary,len);
        iVar5 = strcmp((*pp_Var14)->registry_name,__s2);
        if (iVar5 == 0) {
          pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                               (&cs[j]->summary,len);
          if ((*pp_Var14)->count < 5) {
            pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                                 (&cs[j]->summary,len);
            local_3e8 = strlen(((*pp_Var14)->field_2).key_value);
            if (local_3e8 < 0x40) {
              skipped_tld_length[local_3e8 - 1] = skipped_tld_length[local_3e8 - 1] + 1;
            }
          }
          else {
            pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                                 (&cs[j]->summary,len);
            std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                      ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                       &leaked_tld.
                        super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,pp_Var14);
          }
        }
        else {
          pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                               (&cs[j]->summary,len);
          std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                    ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                     &leaked_tld.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pp_Var14);
        }
      }
    }
  }
  if ((local_5b1 != false) && (local_leak != (CaptureLine *)0x0)) {
    local_1b0->count = (uint64_t)local_leak;
    local_1b0->key_type = 0;
    (local_1b0->field_2).key_number = 0;
    sVar9 = strlen(__s);
    memcpy(__dest,__s,sVar9 + 1);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
              ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
               &leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b0);
  }
  ppp_Var1 = &leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3f0._M_current =
       (_capture_line **)
       std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::begin
                 ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)ppp_Var1);
  i_2 = (size_t)std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::end
                          ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)ppp_Var1);
  std::
  sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,bool(*)(_capture_line*,_capture_line*)>
            (local_3f0,
             (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
              )i_2,CaptureLineIsLower);
  Reserve(this,complete_size + nb_summaries * 0x40);
  tld_line = (CaptureLine *)0x0;
  while( true ) {
    pCVar4 = tld_line;
    bVar15 = false;
    if (local_5b1 != false) {
      pCVar10 = (CaptureLine *)
                std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                          ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                           &leaked_tld.
                            super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar15 = pCVar4 < pCVar10;
    }
    pCVar4 = tld_line;
    if (!bVar15) break;
    tld_line = (CaptureLine *)(tld_line->registry_name + 1);
    pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                         ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                          &leaked_tld.
                           super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)pCVar4);
    memcpy(&nb_locally_leaked_tld,*pp_Var14,0xd0);
    while( true ) {
      pCVar4 = tld_line;
      pCVar10 = (CaptureLine *)
                std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                          ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                           &leaked_tld.
                            super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_5f9 = false;
      if (pCVar4 < pCVar10) {
        pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                              &leaked_tld.
                               super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (size_type)tld_line);
        local_5f9 = CaptureLineIsSameKey(*pp_Var14,(CaptureLine *)&nb_locally_leaked_tld);
      }
      if (local_5f9 == false) break;
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leaked_tld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)tld_line);
      current_line._192_8_ = (*pp_Var14)->count + current_line._192_8_;
      tld_line = (CaptureLine *)(tld_line->registry_name + 1);
    }
    iVar5 = strcmp((char *)&nb_locally_leaked_tld,__s2);
    if (iVar5 == 0) {
      second_ld_line = (CaptureLine *)operator_new(0xd0);
      if (second_ld_line == (CaptureLine *)0x0) {
        local_5b1 = false;
      }
      else {
        memcpy(second_ld_line,&nb_locally_leaked_tld,0xd0);
        std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                  ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                   &leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&second_ld_line);
      }
    }
    else {
      iVar5 = strcmp((char *)&nb_locally_leaked_tld,__s2_00);
      if (iVar5 == 0) {
        tld_line_1 = (CaptureLine *)operator_new(0xd0);
        if (tld_line_1 == (CaptureLine *)0x0) {
          local_5b1 = false;
        }
        else {
          memcpy(tld_line_1,&nb_locally_leaked_tld,0xd0);
          std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                    ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                     &frequent_tld.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&tld_line_1);
        }
      }
      else {
        iVar5 = strcmp((char *)&nb_locally_leaked_tld,__s2_01);
        if (iVar5 == 0) {
          local_418 = (value_type)operator_new(0xd0);
          if (local_418 == (value_type)0x0) {
            local_5b1 = false;
          }
          else {
            memcpy(local_418,&nb_locally_leaked_tld,0xd0);
            std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                      ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id,
                       &local_418);
          }
        }
        else {
          AddLine(this,(CaptureLine *)&nb_locally_leaked_tld,true);
        }
      }
    }
  }
  if (local_5b1 != false) {
    iVar11 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::begin
                       ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id);
    iVar12 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::end
                       ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id);
    std::
    sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,bool(*)(_capture_line*,_capture_line*)>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )iVar11._M_current,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )iVar12._M_current,CaptureLineIsLargerCount);
    for (local_430 = 0;
        sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leak_tld_id), local_430 < sVar13 && local_430 < 0x100;
        local_430 = local_430 + 1) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leak_tld_id,local_430);
      AddLine(this,*pp_Var14,true);
    }
  }
  if (local_5b1 != false) {
    ppp_Var1 = &frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar11 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::begin
                       ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)ppp_Var1);
    iVar12 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::end
                       ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)ppp_Var1);
    std::
    sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,bool(*)(_capture_line*,_capture_line*)>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )iVar11._M_current,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )iVar12._M_current,CaptureLineIsLargerCount);
    for (local_448 = 0;
        sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &frequent_tld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage),
        local_448 < sVar13 && local_448 < 0x100; local_448 = local_448 + 1) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &frequent_tld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_448);
      AddLine(this,*pp_Var14,true);
    }
  }
  if (local_5b1 != false) {
    ppp_Var1 = &leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar11 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::begin
                       ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)ppp_Var1);
    iVar12 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::end
                       ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)ppp_Var1);
    std::
    sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,bool(*)(_capture_line*,_capture_line*)>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )iVar11._M_current,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )iVar12._M_current,CaptureLineIsLargerCount);
    for (i_6 = 0; sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                                     ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                                      &leaked_2ld.
                                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage),
        i_6 < sVar13 && i_6 < 0x100; i_6 = i_6 + 1) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leaked_2ld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,i_6);
      AddLine(this,*pp_Var14,true);
    }
    for (len_1 = 0x100;
        sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leaked_2ld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage),
        len_1 < sVar13 && len_1 < 0x100; len_1 = len_1 + 1) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leaked_2ld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,len_1);
      sVar9 = strlen(((*pp_Var14)->field_2).key_value);
      if (sVar9 < 0x40) {
        skipped_tld_length[sVar9 - 1] = skipped_tld_length[sVar9 - 1] + 1;
      }
    }
  }
  if (local_5b1 != false) {
    for (uStack_478 = 0;
        sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                           (&this->summary), uStack_478 < sVar13; uStack_478 = uStack_478 + 1) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           (&this->summary,uStack_478);
      iVar5 = strcmp((*pp_Var14)->registry_name,__s_00);
      if (((iVar5 == 0) &&
          (pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                                (&this->summary,uStack_478), 0 < ((*pp_Var14)->field_2).key_number))
         && (pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                                  (&this->summary,uStack_478),
            ((*pp_Var14)->field_2).key_number < 0x40)) {
        pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             (&this->summary,uStack_478);
        uVar3 = skipped_tld_length[(long)((*pp_Var14)->field_2).key_number + -1];
        pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             (&this->summary,uStack_478);
        (*pp_Var14)->count = uVar3 + (*pp_Var14)->count;
        pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             (&this->summary,uStack_478);
        skipped_tld_length[(long)((*pp_Var14)->field_2).key_number + -1] = 0;
      }
    }
    for (length_pattern.count._4_4_ = 0; length_pattern.count._4_4_ < 0x40;
        length_pattern.count._4_4_ = length_pattern.count._4_4_ + 1) {
      if (skipped_tld_length[(long)length_pattern.count._4_4_ + -1] != 0) {
        length_pattern._192_8_ = skipped_tld_length[(long)length_pattern.count._4_4_ + -1];
        length_pattern.registry_name[0x38] = '\0';
        length_pattern.registry_name[0x39] = '\0';
        length_pattern.registry_name[0x3a] = '\0';
        length_pattern.registry_name[0x3b] = '\0';
        length_pattern.registry_name[0x3c] = length_pattern.count._4_1_;
        length_pattern.registry_name[0x3d] = length_pattern.count._5_1_;
        length_pattern.registry_name[0x3e] = length_pattern.count._6_1_;
        length_pattern.registry_name[0x3f] = length_pattern.count._7_1_;
        sVar9 = strlen(__s_00);
        memcpy((CaptureLine *)&i_9,__s_00,sVar9 + 1);
        AddLine(this,(CaptureLine *)&i_9,true);
        skipped_tld_length[(long)length_pattern.count._4_4_ + -1] = 0;
      }
    }
  }
  if (local_5b1 != false) {
    Sort(this);
  }
  for (i_10 = 0;
      sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                         ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id)
      , i_10 < sVar13; i_10 = i_10 + 1) {
    pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                         ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id,
                          i_10);
    if (*pp_Var14 != (value_type)0x0) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leak_tld_id,i_10);
      if (*pp_Var14 != (value_type)0x0) {
        operator_delete(*pp_Var14);
      }
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leak_tld_id,i_10);
      *pp_Var14 = (value_type)0x0;
    }
  }
  for (i_11 = 0;
      sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                         ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                          &leaked_2ld.
                           super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage), i_11 < sVar13;
      i_11 = i_11 + 1) {
    pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                         ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                          &leaked_2ld.
                           super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,i_11);
    if (*pp_Var14 != (value_type)0x0) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leaked_2ld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,i_11);
      if (*pp_Var14 != (value_type)0x0) {
        operator_delete(*pp_Var14);
      }
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &leaked_2ld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,i_11);
      *pp_Var14 = (value_type)0x0;
    }
  }
  for (local_568 = 0;
      sVar13 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size
                         ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                          &frequent_tld.
                           super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage), local_568 < sVar13;
      local_568 = local_568 + 1) {
    pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                         ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                          &frequent_tld.
                           super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,local_568);
    if (*pp_Var14 != (value_type)0x0) {
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &frequent_tld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_568);
      if (*pp_Var14 != (value_type)0x0) {
        operator_delete(*pp_Var14);
      }
      pp_Var14 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                           ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
                            &frequent_tld.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_568);
      *pp_Var14 = (value_type)0x0;
    }
  }
  if (local_1b0 != (value_type)0x0) {
    if (local_1b0 != (value_type)0x0) {
      operator_delete(local_1b0);
    }
    local_1b0 = (value_type)0x0;
  }
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::~vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)&leak_tld_id);
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::~vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
             &frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::~vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
             &leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::~vector
            ((vector<_capture_line_*,_std::allocator<_capture_line_*>_> *)
             &leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return local_5b1;
}

Assistant:

bool CaptureSummary::Merge(size_t nb_summaries, CaptureSummary ** cs)
{
    bool ret = true;
    size_t max_size = 0;
    size_t complete_size = 0;
    std::vector<CaptureLine *> complete;
    std::vector<CaptureLine *> leaked_tld;
    std::vector<CaptureLine*> leaked_2ld;
    std::vector<CaptureLine *> frequent_tld;
    char const * leak_tld_id = NULL;
    char const * leak_2ld_id = NULL;
    char const * frequent_tld_id = NULL;
    char const * local_tld_id = NULL;
    char const * leak_by_length_id = NULL;
    char const* name_list_id = NULL;
    char const* addr_list_id = NULL;
    CaptureLine current_line;
    uint64_t nb_locally_leaked_tld = 0;
    CaptureLine *local_leak = new CaptureLine;
    uint64_t skipped_tld_length[64];

    memset(skipped_tld_length, 0, sizeof(skipped_tld_length));

    if (ret)
    {
        leak_tld_id = DnsStats::GetTableName(REGISTRY_DNS_LeakedTLD);
        leak_2ld_id = DnsStats::GetTableName(REGISTRY_DNS_LEAK_2NDLEVEL);
        frequent_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Frequent_TLD_Usage);
        local_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Local_TLD_Usage_Count);
        leak_by_length_id = DnsStats::GetTableName(REGISTRY_DNS_LeakByLength);
        name_list_id = DnsStats::GetTableName(REGISTRY_DNS_ERRONEOUS_NAME_LIST);
        addr_list_id = DnsStats::GetTableName(REGISTRY_DNS_ADDRESS_LIST);

        ret = (leak_tld_id != NULL && frequent_tld_id != NULL && local_tld_id != NULL && leak_by_length_id != NULL && local_leak != NULL
            && name_list_id != NULL && addr_list_id != NULL);
    }

    /* Compute the plausible max size and the complete size */
    for (size_t i = 0; ret && i < nb_summaries; i++)
    {
        if (cs[i]->Size() > max_size)
        {
            max_size = cs[i]->Size();
        }

        complete_size += cs[i]->Size();
    }

    /* Create a complete list that contains all the summaries */
    if (ret)
    {
        complete.reserve(complete_size);
        leaked_tld.reserve(48 * nb_summaries);
        leaked_2ld.reserve(48 * nb_summaries);
        frequent_tld.reserve(16 * nb_summaries);
    }

    for (size_t i = 0; ret && i < nb_summaries; i++) {
        for (size_t j = 0; j < cs[i]->Size(); j++) {
            if (strcmp(cs[i]->summary[j]->registry_name, frequent_tld_id) == 0)
            {
                /* This is a TLD "frequently used" by a client. We will only consider it in the summary
                 * if it is part of the TLD frequently leaked to the root.
                 */  
                if (DnsStats::IsFrequentLeakTld((uint8_t *)cs[i]->summary[j]->key_value,
                    strlen(cs[i]->summary[j]->key_value))) {
                    complete.push_back(cs[i]->summary[j]);
                }
                else
                {
                    nb_locally_leaked_tld += cs[i]->summary[j]->count;
                }
            }
            else if (strcmp(cs[i]->summary[j]->registry_name, leak_tld_id) == 0)
            {
                /* This is a TLD "frequently leaked" to the root */
                if (cs[i]->summary[j]->count <= 4)
                {
                    size_t len = strlen(cs[i]->summary[j]->key_value);

                    if (len < 64)
                    {
                        skipped_tld_length[len]++;
                    }
                }
                else
                {
                    complete.push_back(cs[i]->summary[j]);
                }
            }
            /* TODO: if local leak present, add to total */
            else
            {
                complete.push_back(cs[i]->summary[j]);
            }
        }
    }

    if (ret && nb_locally_leaked_tld != 0)
    {
        local_leak->count = nb_locally_leaked_tld;
        local_leak->key_type = 0;
        local_leak->key_number = 0; 
        
        memcpy(local_leak->registry_name, local_tld_id, strlen(local_tld_id) + 1);

        complete.push_back(local_leak);
    }

    /* Sort the complete list */
    std::sort(complete.begin(), complete.end(), CaptureLineIsLower);

    /* Now go through the list and perform the summations.
     * Put the frequent tld, 2nd ld and tls usage in separate lists */
    Reserve(max_size + 64* nb_summaries);

    for (size_t i = 0; ret && i < complete.size();) {
        /* Read the next capture line */
        current_line = *complete[i++];

        /* Summarize all matching lines */
        while (i < complete.size() && CaptureLineIsSameKey(complete[i], &current_line)) {
            current_line.count += complete[i]->count;
            i++;
        }

        /* Add line to summary, or to one of the special registries */

        if (strcmp(current_line.registry_name, leak_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                leaked_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, leak_2ld_id) == 0) {
            CaptureLine* second_ld_line = new CaptureLine;

            if (second_ld_line != NULL)
            {
                memcpy(second_ld_line, &current_line, sizeof(CaptureLine));
                leaked_2ld.push_back(second_ld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, frequent_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                frequent_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else {
            AddLine(&current_line, true);
        }
    }

    /* Sort and tabulate the most used TLD. */
    if (ret) {
        std::sort(frequent_tld.begin(), frequent_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < frequent_tld.size() && i < 256; i++) {
            AddLine(frequent_tld[i], true);
        }
    }

    /* Sort and tabulate the most used 2LD. */
    if (ret) {
        std::sort(leaked_2ld.begin(), leaked_2ld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_2ld.size() && i < 256; i++) {
            AddLine(leaked_2ld[i], true);
        }
    }

    /* Sort and tabulate the most leaked TLD. 
     * TODO: tabulate the length of the discarded TLD, and correct the captured values */
    if (ret) {
        std::sort(leaked_tld.begin(), leaked_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_tld.size() && i < 256; i++) {
            AddLine(leaked_tld[i], true);
        }

        for (size_t i = 256; i < leaked_tld.size() && i < 256; i++) {
            size_t len = strlen(leaked_tld[i]->key_value);

            if (len < 64)
            {
                skipped_tld_length[len]++;
            }
        }
    }

    if (ret) {
        /* Add the leaked length to the current counts */
        for (size_t i = 0; i < summary.size(); i++)
        {
            if (strcmp(summary[i]->registry_name, leak_by_length_id) == 0 &&
                summary[i]->key_number > 0 &&
                summary[i]->key_number < 64)
            {
                summary[i]->count += skipped_tld_length[summary[i]->key_number];
                skipped_tld_length[summary[i]->key_number] = 0;
            }
        }

        for (int i = 0; i < 64; i++)
        {
            if (skipped_tld_length[i] != 0)
            {
                CaptureLine length_pattern;

                length_pattern.count = skipped_tld_length[i];
                length_pattern.key_type = 0;
                length_pattern.key_number = i;

                memcpy(length_pattern.registry_name, leak_by_length_id, strlen(leak_by_length_id) + 1);

                AddLine(&length_pattern, true);
                skipped_tld_length[i] = 0;
            }
        }
    }

    if (ret) {
        /* Sort the whole thing again */
        Sort();
    }

    /* Clean up */

    for (size_t i = 0; i < frequent_tld.size(); i++)
    {
        if (frequent_tld[i] != NULL)
        {
            delete frequent_tld[i];
            frequent_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_tld.size(); i++)
    {
        if (leaked_tld[i] != NULL)
        {
            delete leaked_tld[i];
            leaked_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_2ld.size(); i++)
    {
        if (leaked_2ld[i] != NULL)
        {
            delete leaked_2ld[i];
            leaked_2ld[i] = NULL;
        }
    }

    if (local_leak != NULL)
    {
        delete local_leak;
        local_leak = NULL;
    }

    return ret;
}